

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUpdateHandler.cxx
# Opt level: O2

int __thiscall cmCTestUpdateHandler::ProcessHandler(cmCTestUpdateHandler *this)

{
  string *value;
  int iVar1;
  cmCTest *pcVar2;
  bool bVar3;
  bool bVar4;
  char *pcVar5;
  ostream *poVar6;
  cmCTestP4 *this_00;
  int iVar7;
  char *pcVar8;
  int iVar9;
  double dVar10;
  double dVar11;
  string end_time;
  allocator local_771;
  string local_770;
  uint start_time_time;
  cmXMLWriter xml;
  ostringstream cmCTestLog_msg_3;
  string local_570;
  string local_550;
  string buildname;
  string start_time;
  cmCLocaleEnvironmentScope fixLocale;
  cmGeneratedFileStream os;
  cmGeneratedFileStream ofs;
  
  cmCLocaleEnvironmentScope::cmCLocaleEnvironmentScope(&fixLocale);
  std::__cxx11::string::string((string *)&ofs,"SourceDirectory",(allocator *)&os);
  pcVar5 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)&ofs);
  std::__cxx11::string::~string((string *)&ofs);
  if (pcVar5 == (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ofs);
    poVar6 = std::operator<<((ostream *)&ofs,
                             "Cannot find SourceDirectory  key in the DartConfiguration.tcl");
    std::endl<char,std::char_traits<char>>(poVar6);
    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,6,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                 ,0x71,(char *)os.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                               _vptr_basic_ostream,false);
    std::__cxx11::string::~string((string *)&os);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ofs);
    iVar9 = -1;
  }
  else {
    cmGeneratedFileStream::cmGeneratedFileStream(&ofs,None);
    bVar3 = cmCTest::GetShowOnly((this->super_cmCTestGenericHandler).CTest);
    if (!bVar3) {
      cmCTestGenericHandler::StartLogFile(&this->super_cmCTestGenericHandler,"Update",&ofs);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
    poVar6 = std::operator<<((ostream *)&os,"   Updating the repository: ");
    poVar6 = std::operator<<(poVar6,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar6);
    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                 ,0x7d,_cmCTestLog_msg_3,(this->super_cmCTestGenericHandler).Quiet);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg_3);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
    bVar3 = SelectVCS(this);
    if (bVar3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
      poVar6 = std::operator<<((ostream *)&os,"   Use ");
      if ((ulong)(uint)this->UpdateType < 7) {
        pcVar8 = cmCTestUpdateHandlerUpdateStrings[(uint)this->UpdateType];
      }
      else {
        pcVar8 = "Unknown";
      }
      poVar6 = std::operator<<(poVar6,pcVar8);
      poVar6 = std::operator<<(poVar6," repository type");
      std::endl<char,std::char_traits<char>>(poVar6);
      pcVar2 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar2,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                   ,0x86,_cmCTestLog_msg_3,(this->super_cmCTestGenericHandler).Quiet);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg_3);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
      switch(this->UpdateType) {
      case 1:
        this_00 = (cmCTestP4 *)operator_new(0x1b8);
        cmCTestCVS::cmCTestCVS
                  ((cmCTestCVS *)this_00,(this->super_cmCTestGenericHandler).CTest,(ostream *)&ofs);
        break;
      case 2:
        this_00 = (cmCTestP4 *)operator_new(0x330);
        cmCTestSVN::cmCTestSVN
                  ((cmCTestSVN *)this_00,(this->super_cmCTestGenericHandler).CTest,(ostream *)&ofs);
        break;
      case 3:
        this_00 = (cmCTestP4 *)operator_new(0x330);
        cmCTestBZR::cmCTestBZR
                  ((cmCTestBZR *)this_00,(this->super_cmCTestGenericHandler).CTest,(ostream *)&ofs);
        break;
      case 4:
        this_00 = (cmCTestP4 *)operator_new(0x318);
        cmCTestGIT::cmCTestGIT
                  ((cmCTestGIT *)this_00,(this->super_cmCTestGenericHandler).CTest,(ostream *)&ofs);
        break;
      case 5:
        this_00 = (cmCTestP4 *)operator_new(0x310);
        cmCTestHG::cmCTestHG
                  ((cmCTestHG *)this_00,(this->super_cmCTestGenericHandler).CTest,(ostream *)&ofs);
        break;
      case 6:
        this_00 = (cmCTestP4 *)operator_new(0x370);
        cmCTestP4::cmCTestP4(this_00,(this->super_cmCTestGenericHandler).CTest,(ostream *)&ofs);
        break;
      default:
        this_00 = (cmCTestP4 *)operator_new(0x188);
        cmCTestVC::cmCTestVC
                  ((cmCTestVC *)this_00,(this->super_cmCTestGenericHandler).CTest,(ostream *)&ofs);
      }
      cmCTestVC::SetCommandLineTool((cmCTestVC *)this_00,&this->UpdateCommand);
      std::__cxx11::string::string((string *)&os,pcVar5,(allocator *)&cmCTestLog_msg_3);
      cmCTestVC::SetSourceDirectory((cmCTestVC *)this_00,(string *)&os);
      std::__cxx11::string::~string((string *)&os);
      cmCTestVC::Cleanup((cmCTestVC *)this_00);
      cmGeneratedFileStream::cmGeneratedFileStream(&os,None);
      bVar3 = cmCTestGenericHandler::StartResultingXML
                        (&this->super_cmCTestGenericHandler,PartUpdate,"Update",&os);
      if (bVar3) {
        cmCTest::CurrentTime_abi_cxx11_(&start_time,(this->super_cmCTestGenericHandler).CTest);
        dVar10 = cmsys::SystemTools::GetTime();
        start_time_time = (uint)(long)dVar10;
        dVar10 = cmsys::SystemTools::GetTime();
        bVar3 = cmCTestVC::Update((cmCTestVC *)this_00);
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::string::string((string *)&xml,"BuildName",(allocator *)&end_time);
        cmCTest::GetCTestConfiguration((string *)&cmCTestLog_msg_3,pcVar2,(string *)&xml);
        cmCTest::SafeBuildIdField(&buildname,(string *)&cmCTestLog_msg_3);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_3);
        std::__cxx11::string::~string((string *)&xml);
        cmXMLWriter::cmXMLWriter(&xml,(ostream *)&os,0);
        cmXMLWriter::StartDocument(&xml,"UTF-8");
        std::__cxx11::string::string((string *)&cmCTestLog_msg_3,"Update",(allocator *)&end_time);
        cmXMLWriter::StartElement(&xml,(string *)&cmCTestLog_msg_3);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_3);
        cmXMLWriter::Attribute<char[7]>(&xml,"mode",(char (*) [7])0x5bac77);
        std::__cxx11::string::string((string *)&end_time,"ctest-",(allocator *)&local_770);
        pcVar5 = cmVersion::GetCMakeVersion();
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &cmCTestLog_msg_3,&end_time,pcVar5);
        cmXMLWriter::Attribute<std::__cxx11::string>
                  (&xml,"Generator",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &cmCTestLog_msg_3);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_3);
        std::__cxx11::string::~string((string *)&end_time);
        std::__cxx11::string::string((string *)&cmCTestLog_msg_3,"Site",(allocator *)&local_570);
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::string::string((string *)&local_770,"Site",(allocator *)&local_550);
        cmCTest::GetCTestConfiguration(&end_time,pcVar2,&local_770);
        cmXMLWriter::Element<std::__cxx11::string>(&xml,(string *)&cmCTestLog_msg_3,&end_time);
        std::__cxx11::string::~string((string *)&end_time);
        std::__cxx11::string::~string((string *)&local_770);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_3);
        std::__cxx11::string::string((string *)&cmCTestLog_msg_3,"BuildName",(allocator *)&end_time)
        ;
        cmXMLWriter::Element<std::__cxx11::string>(&xml,(string *)&cmCTestLog_msg_3,&buildname);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_3);
        std::__cxx11::string::string((string *)&cmCTestLog_msg_3,"BuildStamp",&local_771);
        cmCTest::GetCurrentTag_abi_cxx11_(&local_570,(this->super_cmCTestGenericHandler).CTest);
        std::operator+(&local_770,&local_570,"-");
        cmCTest::GetTestModelString_abi_cxx11_(&local_550,(this->super_cmCTestGenericHandler).CTest)
        ;
        std::operator+(&end_time,&local_770,&local_550);
        cmXMLWriter::Element<std::__cxx11::string>(&xml,(string *)&cmCTestLog_msg_3,&end_time);
        std::__cxx11::string::~string((string *)&end_time);
        std::__cxx11::string::~string((string *)&local_550);
        std::__cxx11::string::~string((string *)&local_770);
        std::__cxx11::string::~string((string *)&local_570);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_3);
        std::__cxx11::string::string
                  ((string *)&cmCTestLog_msg_3,"StartDateTime",(allocator *)&end_time);
        cmXMLWriter::Element<std::__cxx11::string>(&xml,(string *)&cmCTestLog_msg_3,&start_time);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_3);
        std::__cxx11::string::string((string *)&cmCTestLog_msg_3,"StartTime",(allocator *)&end_time)
        ;
        cmXMLWriter::Element<unsigned_int>(&xml,(string *)&cmCTestLog_msg_3,&start_time_time);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_3);
        std::__cxx11::string::string
                  ((string *)&cmCTestLog_msg_3,"UpdateCommand",(allocator *)&end_time);
        value = &(this_00->super_cmCTestGlobalVC).super_cmCTestVC.UpdateCommandLine;
        cmXMLWriter::Element<std::__cxx11::string>(&xml,(string *)&cmCTestLog_msg_3,value);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_3);
        std::__cxx11::string::string
                  ((string *)&cmCTestLog_msg_3,"UpdateType",(allocator *)&local_770);
        if ((ulong)(uint)this->UpdateType < 7) {
          end_time._M_dataplus._M_p = cmCTestUpdateHandlerUpdateStrings[(uint)this->UpdateType];
        }
        else {
          end_time._M_dataplus._M_p = "Unknown";
        }
        cmXMLWriter::Element<char_const*>(&xml,(string *)&cmCTestLog_msg_3,(char **)&end_time);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_3);
        bVar4 = cmCTestVC::WriteXML((cmCTestVC *)this_00,&xml);
        iVar9 = (this_00->super_cmCTestGlobalVC).super_cmCTestVC.PathCount[0];
        if (iVar9 != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_3);
          poVar6 = std::operator<<((ostream *)&cmCTestLog_msg_3,"   Found ");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar9);
          std::operator<<(poVar6," updated files\n");
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar2,2,
                       "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                       ,0xd0,end_time._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
          std::__cxx11::string::~string((string *)&end_time);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_3);
        }
        iVar7 = (this_00->super_cmCTestGlobalVC).super_cmCTestVC.PathCount[1];
        if (iVar7 != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_3);
          poVar6 = std::operator<<((ostream *)&cmCTestLog_msg_3,"   Found ");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar7);
          std::operator<<(poVar6," locally modified files\n");
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar2,2,
                       "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                       ,0xd5,end_time._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
          std::__cxx11::string::~string((string *)&end_time);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_3);
        }
        iVar1 = (this_00->super_cmCTestGlobalVC).super_cmCTestVC.PathCount[2];
        if (iVar1 != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_3);
          poVar6 = std::operator<<((ostream *)&cmCTestLog_msg_3,"   Found ");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar1);
          std::operator<<(poVar6," conflicting files\n");
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar2,2,
                       "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                       ,0xdb,end_time._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
          std::__cxx11::string::~string((string *)&end_time);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_3);
          iVar7 = iVar7 + iVar1;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_3);
        poVar6 = std::operator<<((ostream *)&cmCTestLog_msg_3,"End");
        std::endl<char,std::char_traits<char>>(poVar6);
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,0,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                     ,0xdf,end_time._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
        std::__cxx11::string::~string((string *)&end_time);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_3);
        cmCTest::CurrentTime_abi_cxx11_(&end_time,(this->super_cmCTestGenericHandler).CTest);
        std::__cxx11::string::string
                  ((string *)&cmCTestLog_msg_3,"EndDateTime",(allocator *)&local_770);
        cmXMLWriter::Element<std::__cxx11::string>(&xml,(string *)&cmCTestLog_msg_3,&end_time);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_3);
        std::__cxx11::string::string((string *)&cmCTestLog_msg_3,"EndTime",(allocator *)&local_570);
        dVar11 = cmsys::SystemTools::GetTime();
        local_770._M_dataplus._M_p._0_4_ = (int)(long)dVar11;
        cmXMLWriter::Element<unsigned_int>(&xml,(string *)&cmCTestLog_msg_3,(uint *)&local_770);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_3);
        std::__cxx11::string::string
                  ((string *)&cmCTestLog_msg_3,"ElapsedMinutes",(allocator *)&local_570);
        dVar11 = cmsys::SystemTools::GetTime();
        local_770._M_dataplus._M_p = (pointer)((double)(int)((dVar11 - dVar10) / 6.0) / 10.0);
        cmXMLWriter::Element<double>(&xml,(string *)&cmCTestLog_msg_3,(double *)&local_770);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_3);
        std::__cxx11::string::string
                  ((string *)&cmCTestLog_msg_3,"UpdateReturnStatus",(allocator *)&local_770);
        cmXMLWriter::StartElement(&xml,(string *)&cmCTestLog_msg_3);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_3);
        if (iVar7 != 0) {
          cmXMLWriter::Content<char[72]>
                    (&xml,(char (*) [72])
                          "Update error: There are modified or conflicting files in the repository")
          ;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_3);
          poVar6 = std::operator<<((ostream *)&cmCTestLog_msg_3,
                                   "   There are modified or conflicting files in the repository");
          std::endl<char,std::char_traits<char>>(poVar6);
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar2,6,
                       "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                       ,0xee,local_770._M_dataplus._M_p,false);
          std::__cxx11::string::~string((string *)&local_770);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_3);
        }
        if (!bVar3) {
          cmXMLWriter::Content<char[24]>(&xml,(char (*) [24])"Update command failed:\n");
          cmXMLWriter::Content<std::__cxx11::string>(&xml,value);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_3);
          poVar6 = std::operator<<((ostream *)&cmCTestLog_msg_3,"   Update command failed: ");
          poVar6 = std::operator<<(poVar6,(string *)value);
          std::operator<<(poVar6,"\n");
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar2,2,
                       "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                       ,0xf4,local_770._M_dataplus._M_p,false);
          std::__cxx11::string::~string((string *)&local_770);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_3);
        }
        cmXMLWriter::EndElement(&xml);
        cmXMLWriter::EndElement(&xml);
        cmXMLWriter::EndDocument(&xml);
        if (!bVar4) {
          iVar9 = -1;
        }
        if (!bVar3) {
          iVar9 = -1;
        }
        std::__cxx11::string::~string((string *)&end_time);
        cmXMLWriter::~cmXMLWriter(&xml);
        std::__cxx11::string::~string((string *)&buildname);
        std::__cxx11::string::~string((string *)&start_time);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_3);
        poVar6 = std::operator<<((ostream *)&cmCTestLog_msg_3,"Cannot open log file");
        std::endl<char,std::char_traits<char>>(poVar6);
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,6,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                     ,0xad,(char *)xml.Output,false);
        std::__cxx11::string::~string((string *)&xml);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_3);
        iVar9 = -1;
      }
      cmGeneratedFileStream::~cmGeneratedFileStream(&os);
      (*(this_00->super_cmCTestGlobalVC).super_cmCTestVC._vptr_cmCTestVC[1])(this_00);
    }
    else {
      iVar9 = -1;
    }
    cmGeneratedFileStream::~cmGeneratedFileStream(&ofs);
  }
  cmCLocaleEnvironmentScope::~cmCLocaleEnvironmentScope(&fixLocale);
  return iVar9;
}

Assistant:

int cmCTestUpdateHandler::ProcessHandler()
{
  // Make sure VCS tool messages are in English so we can parse them.
  cmCLocaleEnvironmentScope fixLocale;
  static_cast<void>(fixLocale);

  // Get source dir
  const char* sourceDirectory = this->GetOption("SourceDirectory");
  if (!sourceDirectory) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot find SourceDirectory  key in the DartConfiguration.tcl"
                 << std::endl);
    return -1;
  }

  cmGeneratedFileStream ofs;
  if (!this->CTest->GetShowOnly()) {
    this->StartLogFile("Update", ofs);
  }

  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                     "   Updating the repository: " << sourceDirectory
                                                    << std::endl,
                     this->Quiet);

  if (!this->SelectVCS()) {
    return -1;
  }

  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "   Use "
                       << cmCTestUpdateHandlerUpdateToString(this->UpdateType)
                       << " repository type" << std::endl;
                     , this->Quiet);

  // Create an object to interact with the VCS tool.
  CM_AUTO_PTR<cmCTestVC> vc;
  switch (this->UpdateType) {
    case e_CVS:
      vc.reset(new cmCTestCVS(this->CTest, ofs));
      break;
    case e_SVN:
      vc.reset(new cmCTestSVN(this->CTest, ofs));
      break;
    case e_BZR:
      vc.reset(new cmCTestBZR(this->CTest, ofs));
      break;
    case e_GIT:
      vc.reset(new cmCTestGIT(this->CTest, ofs));
      break;
    case e_HG:
      vc.reset(new cmCTestHG(this->CTest, ofs));
      break;
    case e_P4:
      vc.reset(new cmCTestP4(this->CTest, ofs));
      break;
    default:
      vc.reset(new cmCTestVC(this->CTest, ofs));
      break;
  }
  vc->SetCommandLineTool(this->UpdateCommand);
  vc->SetSourceDirectory(sourceDirectory);

  // Cleanup the working tree.
  vc->Cleanup();

  //
  // Now update repository and remember what files were updated
  //
  cmGeneratedFileStream os;
  if (!this->StartResultingXML(cmCTest::PartUpdate, "Update", os)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE, "Cannot open log file"
                 << std::endl);
    return -1;
  }
  std::string start_time = this->CTest->CurrentTime();
  unsigned int start_time_time =
    static_cast<unsigned int>(cmSystemTools::GetTime());
  double elapsed_time_start = cmSystemTools::GetTime();

  bool updated = vc->Update();
  std::string buildname =
    cmCTest::SafeBuildIdField(this->CTest->GetCTestConfiguration("BuildName"));

  cmXMLWriter xml(os);
  xml.StartDocument();
  xml.StartElement("Update");
  xml.Attribute("mode", "Client");
  xml.Attribute("Generator",
                std::string("ctest-") + cmVersion::GetCMakeVersion());
  xml.Element("Site", this->CTest->GetCTestConfiguration("Site"));
  xml.Element("BuildName", buildname);
  xml.Element("BuildStamp", this->CTest->GetCurrentTag() + "-" +
                this->CTest->GetTestModelString());
  xml.Element("StartDateTime", start_time);
  xml.Element("StartTime", start_time_time);
  xml.Element("UpdateCommand", vc->GetUpdateCommandLine());
  xml.Element("UpdateType",
              cmCTestUpdateHandlerUpdateToString(this->UpdateType));

  bool loadedMods = vc->WriteXML(xml);

  int localModifications = 0;
  int numUpdated = vc->GetPathCount(cmCTestVC::PathUpdated);
  if (numUpdated) {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                       "   Found " << numUpdated << " updated files\n",
                       this->Quiet);
  }
  if (int numModified = vc->GetPathCount(cmCTestVC::PathModified)) {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "   Found "
                         << numModified << " locally modified files\n",
                       this->Quiet);
    localModifications += numModified;
  }
  if (int numConflicting = vc->GetPathCount(cmCTestVC::PathConflicting)) {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                       "   Found " << numConflicting << " conflicting files\n",
                       this->Quiet);
    localModifications += numConflicting;
  }

  cmCTestOptionalLog(this->CTest, DEBUG, "End" << std::endl, this->Quiet);
  std::string end_time = this->CTest->CurrentTime();
  xml.Element("EndDateTime", end_time);
  xml.Element("EndTime", static_cast<unsigned int>(cmSystemTools::GetTime()));
  xml.Element(
    "ElapsedMinutes",
    static_cast<int>((cmSystemTools::GetTime() - elapsed_time_start) / 6) /
      10.0);

  xml.StartElement("UpdateReturnStatus");
  if (localModifications) {
    xml.Content("Update error: "
                "There are modified or conflicting files in the repository");
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "   There are modified or conflicting files in the repository"
                 << std::endl);
  }
  if (!updated) {
    xml.Content("Update command failed:\n");
    xml.Content(vc->GetUpdateCommandLine());
    cmCTestLog(this->CTest, HANDLER_OUTPUT, "   Update command failed: "
                 << vc->GetUpdateCommandLine() << "\n");
  }
  xml.EndElement(); // UpdateReturnStatus
  xml.EndElement(); // Update
  xml.EndDocument();
  return updated && loadedMods ? numUpdated : -1;
}